

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::LE_EulerAngles::Decode(LE_EulerAngles *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  LE_EulerAngles *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 3) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = operator>>(local_18,&(this->m_Psi).super_DataTypeBase);
  pKVar2 = operator>>(pKVar2,&(this->m_Theta).super_DataTypeBase);
  operator>>(pKVar2,&(this->m_Phi).super_DataTypeBase);
  return;
}

Assistant:

void LE_EulerAngles::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < LE_EULER_ANGLES_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> KDIS_STREAM m_Psi
           >> KDIS_STREAM m_Theta
           >> KDIS_STREAM m_Phi;
}